

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O3

int __thiscall deqp::gls::RandomShaderCase::init(RandomShaderCase *this,EVP_PKEY_CTX *ctx)

{
  Shader *vertexShader;
  Shader *fragmentShader;
  char *pcVar1;
  undefined4 uVar2;
  ShaderInput *pSVar3;
  Variable *pVVar4;
  pointer pSVar5;
  pointer pSVar6;
  undefined4 uVar8;
  pointer puVar7;
  ulong uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  int extraout_EAX;
  long lVar17;
  TextureCube *pTVar18;
  mapped_type *ppTVar19;
  TestError *this_00;
  pointer ppSVar20;
  unsigned_short uVar21;
  uint uVar22;
  pointer pVVar23;
  int iVar24;
  unsigned_short uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ProgramGenerator programGenerator;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> unifiedUniforms;
  VertexArray vtxArray;
  Random rnd;
  ProgramGenerator local_142;
  allocator<char> local_141;
  RandomShaderCase *local_140;
  ulong local_138;
  TextureManager *local_130;
  int local_124;
  ulong local_120;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> local_118;
  undefined1 local_f8 [12];
  float fStack_ec;
  undefined1 local_e8 [16];
  pointer local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  int local_c0;
  VariableType *local_b8;
  pointer pMStack_b0;
  pointer local_a8;
  pointer pMStack_a0;
  vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_> *local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  long *local_60 [2];
  long local_50 [2];
  deRandom local_40;
  
  rsg::ProgramGenerator::ProgramGenerator(&local_142);
  vertexShader = &this->m_vertexShader;
  fragmentShader = &this->m_fragmentShader;
  rsg::ProgramGenerator::generate(&local_142,&this->m_parameters,vertexShader,fragmentShader);
  checkShaderLimits(this,vertexShader);
  checkShaderLimits(this,fragmentShader);
  checkProgramLimits(this,vertexShader,fragmentShader);
  local_118.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_40,(this->m_parameters).seed);
  rsg::computeUnifiedUniforms(vertexShader,fragmentShader,&local_118);
  rsg::computeUniformValues((Random *)&local_40,&this->m_uniforms,&local_118);
  iVar16 = this->m_gridWidth;
  iVar24 = this->m_gridHeight;
  ppSVar20 = (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_140 = this;
  if (ppSVar20 !=
      (this->m_vertexShader).m_inputs.
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_120 = (ulong)(uint)((iVar24 + 1) * (iVar16 + 1));
    local_98 = &this->m_vertexArrays;
    local_88 = local_120;
    do {
      pSVar3 = *ppSVar20;
      pVVar4 = pSVar3->m_variable;
      pSVar5 = (pSVar3->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      pSVar6 = (pSVar3->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar22 = (pVVar4->m_type).m_numElements;
      local_e8._0_8_ = pSVar3;
      local_90 = ppSVar20;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(local_e8 + 8),
                 (long)(int)(uVar22 * (int)local_120),(allocator_type *)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,(pSVar3->m_variable->m_name)._M_dataplus._M_p,&local_141);
      local_124 = std::__cxx11::string::compare((char *)local_60);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if ((pSVar3->m_variable->m_type).m_baseType != TYPE_FLOAT) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                   ,0xa5);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)local_120) {
        local_138 = 0;
        uVar26 = 0;
        do {
          uVar14 = local_e8._8_8_;
          uVar2 = local_140->m_gridWidth;
          uVar8 = local_140->m_gridHeight;
          uVar9 = (ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff;
          auVar28._0_4_ = (float)(int)((long)uVar9 % (long)(uVar2 + 1));
          auVar28._4_4_ = (float)(int)((long)uVar9 / (long)(uVar2 + 1));
          auVar28._8_8_ = 0;
          auVar29._0_4_ = (float)(int)uVar2;
          auVar29._4_4_ = (float)(int)uVar8;
          auVar29._8_8_ = 0;
          auVar29 = divps(auVar28,auVar29);
          local_80 = uVar26;
          if (local_124 == 0) {
            pcVar1 = (char *)(local_e8._8_8_ + (long)(int)(uVar22 * (int)uVar26) * 4);
            *(ulong *)pcVar1 = CONCAT44(auVar29._4_4_ * -2.0 + 1.0,auVar29._0_4_ * 2.0 + -1.0);
            pcVar1[8] = '\0';
            pcVar1[9] = '\0';
            pcVar1[10] = '\0';
            pcVar1[0xb] = '\0';
            pcVar1[0xc] = '\0';
            pcVar1[0xd] = '\0';
            pcVar1[0xe] = -0x80;
            pcVar1[0xf] = '?';
          }
          else {
            _local_f8 = auVar29;
            if (0 < (int)uVar22) {
              lVar17 = (long)(int)local_138;
              local_f8._8_4_ = auVar29._8_4_;
              fStack_ec = auVar29._12_4_;
              local_78 = 1.0 - auVar29._0_4_;
              fStack_74 = 1.0 - auVar29._4_4_;
              fStack_70 = 0.0 - (float)local_f8._8_4_;
              fStack_6c = 0.0 - fStack_ec;
              uVar26 = 0;
              do {
                rsg::VariableType::getElementType(&pVVar4->m_type);
                local_130 = (TextureManager *)CONCAT44(local_130._4_4_,pSVar5[uVar26].intVal);
                rsg::VariableType::getElementType(&pVVar4->m_type);
                uVar27 = -(uint)((uVar26 & 2) == 0);
                uVar30 = -(uint)((uVar26 & 1) == 0);
                *(float *)(uVar14 + uVar26 * 4 + lVar17 * 4) =
                     (pSVar6[uVar26].floatVal - local_130._0_4_) *
                     ((float)(~uVar30 & (uint)fStack_74 | local_f8._4_4_ & uVar30) +
                     (float)(~uVar27 & (uint)local_78 | local_f8._0_4_ & uVar27)) * 0.5 +
                     local_130._0_4_;
                uVar26 = uVar26 + 1;
              } while (uVar22 != uVar26);
            }
          }
          uVar26 = local_80 + 1;
          local_138 = (ulong)((int)local_138 + uVar22);
        } while (uVar26 != local_88);
      }
      std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::push_back
                (local_98,(value_type *)local_e8);
      this = local_140;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_e8._8_8_,
                        CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) -
                        local_e8._8_8_);
      }
      ppSVar20 = local_90 + 1;
    } while (ppSVar20 !=
             (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    iVar16 = this->m_gridWidth;
    iVar24 = this->m_gridHeight;
  }
  uVar22 = iVar24 * iVar16;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(int)(uVar22 * 6));
  if (0 < (int)uVar22) {
    iVar16 = this->m_gridWidth;
    sVar13 = (short)iVar16 + 1;
    puVar7 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar24 = 0;
    uVar26 = 0;
    do {
      uVar9 = (ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff;
      sVar12 = (short)((long)uVar9 / (long)iVar16);
      sVar11 = sVar12 * sVar13;
      sVar10 = (short)((long)uVar9 % (long)iVar16);
      puVar7[iVar24] = sVar10 + sVar11;
      sVar12 = (sVar12 + 1) * sVar13;
      uVar21 = sVar10 + sVar12;
      puVar7[iVar24 + 1] = uVar21;
      uVar25 = sVar10 + 1 + sVar11;
      puVar7[iVar24 + 2] = uVar25;
      puVar7[iVar24 + 3] = uVar25;
      puVar7[iVar24 + 4] = uVar21;
      puVar7[iVar24 + 5] = sVar10 + 1 + sVar12;
      uVar26 = uVar26 + 1;
      iVar24 = iVar24 + 6;
    } while (uVar22 != uVar26);
  }
  pVVar23 = (this->m_uniforms).
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar23 !=
      (this->m_uniforms).super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_f8._0_8_ = &(this->m_texManager).m_texCube;
    local_130 = &this->m_texManager;
    do {
      pVVar4 = pVVar23->m_variable;
      if (((pVVar4->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
        iVar16 = ((pVVar23->m_storage).m_value.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start)->intVal;
        local_e8._0_8_ = (ShaderInput *)0x6;
        local_d8 = (pointer)0x0;
        local_d0._M_local_buf[0] = '\0';
        local_c0 = 1;
        local_a8 = (pointer)0x0;
        pMStack_a0 = (pointer)0x0;
        local_b8 = (VariableType *)0x0;
        pMStack_b0 = (pointer)0x0;
        local_e8._8_8_ = &local_d0;
        bVar15 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)local_e8);
        rsg::VariableType::~VariableType((VariableType *)local_e8);
        if (bVar15) {
          pTVar18 = (TextureCube *)getTex2D(local_140);
          local_e8._0_4_ = iVar16;
          ppTVar19 = (mapped_type *)
                     std::
                     map<int,_const_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::Texture2D_*>_>_>
                     ::operator[](&local_130->m_tex2D,(key_type *)local_e8);
        }
        else {
          local_e8._0_8_ = (ShaderInput *)0x7;
          local_d8 = (pointer)0x0;
          local_d0._M_local_buf[0] = '\0';
          local_c0 = 1;
          local_a8 = (pointer)0x0;
          pMStack_a0 = (pointer)0x0;
          local_b8 = (VariableType *)0x0;
          pMStack_b0 = (pointer)0x0;
          local_e8._8_8_ = &local_d0;
          bVar15 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)local_e8);
          rsg::VariableType::~VariableType((VariableType *)local_e8);
          if (!bVar15) goto LAB_008fc1a4;
          pTVar18 = getTexCube(local_140);
          local_e8._0_4_ = iVar16;
          ppTVar19 = std::
                     map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
                     ::operator[]((map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
                                   *)local_f8._0_8_,(key_type *)local_e8);
        }
        *ppTVar19 = pTVar18;
      }
LAB_008fc1a4:
      pVVar23 = pVVar23 + 1;
    } while (pVVar23 !=
             (local_140->m_uniforms).
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_118.
      super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  rsg::ProgramGenerator::~ProgramGenerator(&local_142);
  return extraout_EAX;
}

Assistant:

void RandomShaderCase::init (void)
{
	// Generate shaders
	rsg::ProgramGenerator programGenerator;
	programGenerator.generate(m_parameters, m_vertexShader, m_fragmentShader);

	checkShaderLimits(m_vertexShader);
	checkShaderLimits(m_fragmentShader);
	checkProgramLimits(m_vertexShader, m_fragmentShader);

	// Compute uniform values
	std::vector<const rsg::ShaderInput*>	unifiedUniforms;
	de::Random								rnd(m_parameters.seed);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, unifiedUniforms);
	rsg::computeUniformValues(rnd, m_uniforms, unifiedUniforms);

	// Generate vertices
	const vector<rsg::ShaderInput*>&	inputs		= m_vertexShader.getInputs();
	int									numVertices	= (m_gridWidth+1)*(m_gridHeight+1);

	for (vector<rsg::ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		const rsg::ShaderInput*			input			= *i;
		rsg::ConstValueRangeAccess		valueRange		= input->getValueRange();
		int								numComponents	= input->getVariable()->getType().getNumElements();
		VertexArray						vtxArray(input, numVertices);
		bool							isPosition		= string(input->getVariable()->getName()) == "dEQP_Position";

		TCU_CHECK(input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
		{
			int		y	= vtxNdx / (m_gridWidth+1);
			int		x	= vtxNdx - y*(m_gridWidth+1);
			float	xf	= (float)x / (float)m_gridWidth;
			float	yf	= (float)y / (float)m_gridHeight;
			float*	dst	= &vtxArray.getVertices()[vtxNdx*numComponents];

			if (isPosition)
			{
				// Position attribute gets special interpolation handling.
				DE_ASSERT(numComponents == 4);
				dst[0] = -1.0f + xf *  2.0f;
				dst[1] =  1.0f + yf * -2.0f;
				dst[2] = 0.0f;
				dst[3] = 1.0f;
			}
			else
			{
				for (int compNdx = 0; compNdx < numComponents; compNdx++)
				{
					float	minVal	= valueRange.getMin().component(compNdx).asFloat();
					float	maxVal	= valueRange.getMax().component(compNdx).asFloat();
					float	xd, yd;

					rsg::getVertexInterpolationCoords(xd, yd, xf, yf, compNdx);

					float	f		= (xd+yd) / 2.0f;

					dst[compNdx] = minVal + f * (maxVal-minVal);
				}
			}
		}

		m_vertexArrays.push_back(vtxArray);
	}

	// Generate indices
	int numQuads	= m_gridWidth*m_gridHeight;
	int numIndices	= numQuads*6;
	m_indices.resize(numIndices);
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (m_gridWidth);
		int quadX	= quadNdx - quadY*m_gridWidth;

		m_indices[quadNdx*6+0] = (deUint16)(quadX + quadY*(m_gridWidth+1));
		m_indices[quadNdx*6+1] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1));
		m_indices[quadNdx*6+2] = (deUint16)(quadX + quadY*(m_gridWidth+1) + 1);
		m_indices[quadNdx*6+3] = (deUint16)(m_indices[quadNdx*6+2]);
		m_indices[quadNdx*6+4] = (deUint16)(m_indices[quadNdx*6+1]);
		m_indices[quadNdx*6+5] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1) + 1);
	}

	// Create textures.
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		const rsg::VariableType& type = uniformIter->getVariable()->getType();

		if (!type.isSampler())
			continue;

		int unitNdx = uniformIter->getValue().asInt(0);

		if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_2D, 1))
			m_texManager.bindTexture(unitNdx, getTex2D());
		else if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_CUBE, 1))
			m_texManager.bindTexture(unitNdx, getTexCube());
		else
			DE_ASSERT(DE_FALSE);
	}
}